

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int genPiecesRecusively(piecefunc_t *gen,PieceEnv *env,Piece *current,int depth)

{
  uint uVar1;
  Piece *pPVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  char cVar6;
  char cVar7;
  PieceEnv *pPVar8;
  PieceEnv *pPVar9;
  long lVar10;
  int n_local;
  PieceEnv env_local;
  int local_94;
  PieceEnv local_90;
  
  iVar3 = 0;
  if (depth < 9) {
    local_94 = 0;
    pPVar8 = env;
    pPVar9 = &local_90;
    for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
      pPVar9->list = pPVar8->list;
      pPVar8 = (PieceEnv *)&pPVar8->n;
      pPVar9 = (PieceEnv *)&pPVar9->n;
    }
    local_90.list = env->list + *env->n;
    local_90.n = &local_94;
    iVar3 = (*gen)(&local_90,current,depth);
    if (iVar3 == 0) {
LAB_0010fdd1:
      iVar3 = 0;
    }
    else {
      uVar4 = *env->rng * 0x5deece66d + 0xb;
      *env->rng = uVar4 & 0xffffffffffff;
      if (0 < (long)local_94) {
        uVar1 = *env->n;
        lVar5 = 0;
        do {
          local_90.list[lVar5].depth = (int8_t)(uVar4 >> 0x10);
          if (0 < (int)uVar1) {
            pPVar2 = env->list;
            lVar10 = 0;
            do {
              cVar7 = '\0';
              cVar6 = '\0';
              if ((((local_90.list[lVar5].bb0.x <= *(int *)((long)&(pPVar2->bb1).x + lVar10)) &&
                   (*(int *)((long)&(pPVar2->bb0).x + lVar10) <= local_90.list[lVar5].bb1.x)) &&
                  (local_90.list[lVar5].bb0.z <= *(int *)((long)&(pPVar2->bb1).z + lVar10))) &&
                 (((cVar7 = cVar6,
                   *(int *)((long)&(pPVar2->bb0).z + lVar10) <= local_90.list[lVar5].bb1.z &&
                   (local_90.list[lVar5].bb0.y <= *(int *)((long)&(pPVar2->bb1).y + lVar10))) &&
                  (*(int *)((long)&(pPVar2->bb0).y + lVar10) <= local_90.list[lVar5].bb1.y)))) {
                cVar7 = (current->depth == (&pPVar2->depth)[lVar10]) * '\x04' + '\x01';
              }
              if (cVar7 != '\0') {
                if (cVar7 != '\x05') goto LAB_0010fdd1;
                break;
              }
              lVar10 = lVar10 + 0x38;
            } while ((ulong)uVar1 * 0x38 - lVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != local_94);
      }
      *env->n = *env->n + local_94;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static
int genPiecesRecusively(piecefunc_t gen, PieceEnv *env, Piece *current, int depth)
{
    if (depth > 8)
        return 0;
    int i, j, n_local = 0;
    PieceEnv env_local = *env;
    env_local.list = env->list + *env->n;
    env_local.n = &n_local;
    if (!gen(&env_local, current, depth))
        return 0;
    int gendepth = next(env->rng, 32);
    for (i = 0; i < n_local; i++)
    {
        Piece *p = env_local.list + i;
        p->depth = gendepth;
        for (j = 0; j < *env->n; j++)
        {   // check for piece with bounding box collition
            Piece *q = env->list + j;
            if (q->bb1.x >= p->bb0.x && q->bb0.x <= p->bb1.x &&
                q->bb1.z >= p->bb0.z && q->bb0.z <= p->bb1.z &&
                q->bb1.y >= p->bb0.y && q->bb0.y <= p->bb1.y)
            {
                if (current->depth != q->depth)
                    return 0;
                break;
            }
        }
    }
    (*env->n) += n_local;
    return 1;
}